

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O0

void __thiscall ManyDoublesParseTest::RunShard(ManyDoublesParseTest *this,int shard)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  double dVar4;
  AssertHelper local_f8;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_d0;
  Message local_c8;
  Result local_c0;
  Enum local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  uint64_t me;
  int len;
  double value;
  uint64_t bits;
  int top_byte;
  int last_top_byte;
  uint32_t halfbits;
  uint32_t last_bits;
  char buffer [100];
  int shard_local;
  ManyDoublesParseTest *this_local;
  
  last_top_byte = 0;
  bits._4_4_ = 0xffffffff;
  top_byte = shard;
  buffer._92_4_ = shard;
  unique0x10000372 = this;
  do {
    if ((uint)top_byte < (uint)last_top_byte) {
      if (buffer._92_4_ == 0) {
        printf("done.\n");
        fflush(_stdout);
      }
      return;
    }
    if ((buffer._92_4_ == 0) && (bits._0_4_ = (uint)top_byte >> 0x18, (uint)bits != bits._4_4_)) {
      printf("value: 0x%08x (%d%%)\r",(ulong)(uint)top_byte,
             (ulong)(uint)(int)(((double)(uint)top_byte * 100.0) / 4294967295.0));
      fflush(_stdout);
      bits._4_4_ = (uint)bits;
    }
    value = (double)CONCAT44(top_byte,top_byte);
    bVar1 = is_infinity_or_nan((uint64_t)value);
    if (!bVar1) {
      dVar4 = bit_cast<double,unsigned_long>((unsigned_long)value);
      iVar2 = snprintf((char *)&halfbits,100,"%a",dVar4);
      local_bc = Ok;
      local_c0 = wabt::ParseDouble(Hexfloat,(char *)&halfbits,
                                   (char *)((long)&halfbits + (long)iVar2),
                                   (uint64_t *)&gtest_ar.message_);
      testing::internal::EqHelper::Compare<wabt::Result::Enum,_wabt::Result,_nullptr>
                ((EqHelper *)local_b8,"Result::Ok",
                 "ParseDouble(LiteralType::Hexfloat, buffer, buffer + len, &me)",&local_bc,&local_c0
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
      if (!bVar1) {
        testing::Message::Message(&local_c8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-hexfloat.cc"
                   ,0xc3,pcVar3);
        testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        testing::Message::~Message(&local_c8);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) {
        return;
      }
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_e8,"me","bits",(unsigned_long *)&gtest_ar.message_,
                 (unsigned_long *)&value);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
      if (!bVar1) {
        testing::Message::Message(&local_f0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-hexfloat.cc"
                   ,0xc4,pcVar3);
        testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
        testing::internal::AssertHelper::~AssertHelper(&local_f8);
        testing::Message::~Message(&local_f0);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) {
        return;
      }
    }
    last_top_byte = top_byte;
    top_byte = (this->super_ThreadedTest).num_threads_ + top_byte;
  } while( true );
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(halfbits) {
      LOG_COMPLETION(halfbits);
      uint64_t bits = (static_cast<uint64_t>(halfbits) << 32) | halfbits;
      if (is_infinity_or_nan(bits))
        continue;

      double value = bit_cast<double>(bits);
      int len = snprintf(buffer, sizeof(buffer), "%a", value);

      uint64_t me;
      ASSERT_EQ(Result::Ok,
                ParseDouble(LiteralType::Hexfloat, buffer, buffer + len, &me));
      ASSERT_EQ(me, bits);
    }
    LOG_DONE();
  }